

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,int param_2,SingleSparseVecWrtFactory<int,_double> *svwf)

{
  bool bVar1;
  NLModel *this_00;
  NLFeeder_Easy *in_RDI;
  reference rVar2;
  int j;
  double *c;
  SparseVectorWriter<int,_double> svw;
  int in_stack_ffffffffffffff7c;
  NLFeeder_Easy *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff90;
  SingleSparseVecWrtFactory<int,_double> *in_stack_ffffffffffffff98;
  reference local_48;
  int local_34;
  double *local_30;
  SparseVectorWriter<int,_double> local_28 [2];
  
  if ((in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros != 0) {
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    this_00 = NLME(in_RDI);
    local_30 = NLModel::ObjCoefficients(this_00);
    for (local_34 = 0;
        local_34 < (in_RDI->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars;
        local_34 = local_34 + 1) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                         (size_type)in_stack_ffffffffffffff98);
      local_48 = rVar2;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_48);
      in_stack_ffffffffffffff98 = (SingleSparseVecWrtFactory<int,_double> *)rVar2._M_p;
      if (bVar1) {
        VPerm(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        if (local_30 == (double *)0x0) {
          in_stack_ffffffffffffff80 = (NLFeeder_Easy *)0x0;
        }
        else {
          in_stack_ffffffffffffff80 = (NLFeeder_Easy *)local_30[local_34];
        }
        NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
        SparseVectorWriter<int,_double>::Write
                  ((SparseVectorWriter<int,_double> *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff7c,5.75768293562722e-318);
        in_stack_ffffffffffffff98 = (SingleSparseVecWrtFactory<int,_double> *)rVar2._M_p;
      }
    }
    NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter(local_28);
  }
  return;
}

Assistant:

void FeedObjGradient(int , ObjGradWriterFactory& svwf) {
    if (header_.num_obj_nonzeros) {
      auto svw = svwf.MakeVectorWriter(header_.num_obj_nonzeros);
      auto c = NLME().ObjCoefficients();
      for (int j=0; j<header_.num_vars; ++j)
        if (obj_grad_supp_[j])
          svw.Write(VPerm(j), c ? c[j] : 0.0);
    }
  }